

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.cpp
# Opt level: O0

void __thiscall Curve::findSegment(Curve *this,double xseg,double *slope,double *intercept)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  int local_34;
  int local_30;
  int i;
  int segment;
  int n;
  double *intercept_local;
  double *slope_local;
  double xseg_local;
  Curve *this_local;
  
  sVar5 = std::vector<double,_std::allocator<double>_>::size(&this->xData);
  iVar4 = (int)sVar5;
  local_30 = iVar4 + -1;
  if (iVar4 == 1) {
    *intercept = 0.0;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,0);
    if ((*pvVar6 != 0.0) || (NAN(*pvVar6))) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->yData,0);
      dVar1 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,0);
      *slope = dVar1 / *pvVar6;
    }
    else {
      *slope = 0.0;
    }
  }
  else {
    for (local_34 = 1; local_34 < iVar4; local_34 = local_34 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,(long)local_34)
      ;
      if (xseg <= *pvVar6) {
        local_30 = local_34;
        break;
      }
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->yData,(long)local_30);
    dVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->yData,(long)(local_30 + -1));
    dVar2 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,(long)local_30);
    dVar3 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->xData,(long)(local_30 + -1));
    *slope = (dVar1 - dVar2) / (dVar3 - *pvVar6);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->yData,(long)local_30);
    dVar1 = *pvVar6;
    dVar2 = *slope;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,(long)local_30);
    *intercept = -dVar2 * *pvVar6 + dVar1;
  }
  return;
}

Assistant:

void Curve::findSegment(double xseg, double& slope, double& intercept)
{
    int n = xData.size();
    int segment = n-1;

    if (n == 1)
    {
        intercept = 0.0;
        if (xData[0] == 0.0) slope = 0.0;
        else slope = yData[0] / xData[0];
    }

    else
    {
        for (int i = 1; i < n; i++)
        {
            if (xseg <= xData[i])
            {
                segment = i;
                break;
            }
        }
        slope = (yData[segment] - yData[segment-1]) /
                (xData[segment] - xData[segment-1]);
        intercept = yData[segment] - slope * xData[segment];
    }
}